

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkDirFrame.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLinkDirFrame::SetDirectionInAbsoluteCoords
          (ChLinkDirFrame *this,ChVector<double> *dir_abs)

{
  ChFrame<double> *this_00;
  ChVector<double> dir_loc;
  
  this_00 = (ChFrame<double> *)
            (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00 != (ChFrame<double> *)0x0) {
    ChFrame<double>::TransformDirectionParentToLocal(&dir_loc,this_00,dir_abs);
    SetDirectionInBodyCoords(this,&dir_loc);
    return;
  }
  __assert_fail("m_body",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChLinkDirFrame.cpp"
                ,0x31,
                "void chrono::fea::ChLinkDirFrame::SetDirectionInAbsoluteCoords(const ChVector<> &)"
               );
}

Assistant:

void ChLinkDirFrame::SetDirectionInAbsoluteCoords(const ChVector<>& dir_abs) {
    assert(m_body);
    ChVector<> dir_loc = m_body->TransformDirectionParentToLocal(dir_abs);
    SetDirectionInBodyCoords(dir_loc);
}